

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector1.cpp
# Opt level: O1

void embree::avx512::BVHNIntersector1<8,_257,_false,_embree::avx512::VirtualCurveIntersector1>::
     occluded(Intersectors *This,Ray *ray,RayQueryContext *context)

{
  float fVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined4 uVar4;
  undefined4 uVar5;
  undefined4 uVar6;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar7;
  bool bVar8;
  undefined1 auVar9 [32];
  undefined8 uVar10;
  undefined1 auVar11 [12];
  undefined1 auVar12 [32];
  char cVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  int iVar17;
  long lVar18;
  NodeRef *pNVar19;
  ulong uVar20;
  ulong uVar21;
  ulong unaff_R15;
  byte bVar22;
  ulong uVar23;
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar43 [64];
  undefined1 auVar44 [64];
  undefined1 extraout_var [56];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar45 [64];
  undefined1 auVar46 [64];
  undefined1 extraout_var_00 [56];
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  float fVar49;
  undefined1 auVar50 [32];
  undefined1 auVar51 [16];
  undefined1 auVar52 [32];
  float fVar53;
  undefined1 auVar54 [16];
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  undefined1 auVar57 [32];
  undefined1 auVar58 [16];
  vfloat4 a0;
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  Precalculations pre;
  NodeRef stack [564];
  
  if (*(long *)&This->ptr[1].bounds.bounds0.lower.field_0 != 8) {
    fVar1 = ray->tfar;
    auVar43 = ZEXT464((uint)fVar1);
    auVar45 = ZEXT1664(ZEXT816(0) << 0x40);
    if (0.0 <= fVar1) {
      aVar7 = (ray->dir).field_0.field_1;
      auVar58 = vdpps_avx((undefined1  [16])aVar7,(undefined1  [16])aVar7,0x7f);
      auVar11 = ZEXT812(0) << 0x20;
      auVar51 = ZEXT816(0) << 0x40;
      auVar54._4_12_ = auVar11;
      auVar54._0_4_ = auVar58._0_4_;
      auVar24 = vrsqrt14ss_avx512f(auVar51,auVar54);
      fVar53 = auVar24._0_4_;
      pre.depth_scale = fVar53 * 1.5 - auVar58._0_4_ * 0.5 * fVar53 * fVar53 * fVar53;
      uVar2 = *(undefined4 *)&(ray->dir).field_0;
      uVar3 = *(undefined4 *)((long)&(ray->dir).field_0 + 4);
      fVar53 = (ray->dir).field_0.m128[2];
      auVar59._0_4_ = aVar7.x * pre.depth_scale;
      auVar59._4_4_ = aVar7.y * pre.depth_scale;
      auVar59._8_4_ = aVar7.z * pre.depth_scale;
      auVar59._12_4_ = aVar7.field_3.w * pre.depth_scale;
      auVar24 = vshufpd_avx(auVar59,auVar59,1);
      auVar58 = vmovshdup_avx(auVar59);
      auVar47._8_4_ = 0x80000000;
      auVar47._0_8_ = 0x8000000080000000;
      auVar47._12_4_ = 0x80000000;
      auVar36._16_4_ = 0x80000000;
      auVar36._0_16_ = auVar47;
      auVar36._20_4_ = 0x80000000;
      auVar36._24_4_ = 0x80000000;
      auVar36._28_4_ = 0x80000000;
      auVar62._0_4_ = auVar58._0_4_ ^ 0x80000000;
      auVar58 = vunpckhps_avx(auVar59,auVar51);
      auVar62._4_12_ = auVar11;
      auVar27 = vshufps_avx(auVar58,auVar62,0x41);
      auVar60._0_8_ = auVar24._0_8_ ^ 0x8000000080000000;
      auVar60._8_8_ = auVar24._8_8_ ^ auVar47._8_8_;
      auVar26 = vinsertps_avx(auVar60,auVar59,0x2a);
      auVar58 = vdpps_avx(auVar27,auVar27,0x7f);
      auVar24 = vdpps_avx(auVar26,auVar26,0x7f);
      uVar10 = vcmpps_avx512vl(auVar24,auVar58,1);
      auVar58 = vpmovm2d_avx512vl(uVar10);
      auVar63._0_4_ = auVar58._0_4_;
      auVar63._4_4_ = auVar63._0_4_;
      auVar63._8_4_ = auVar63._0_4_;
      auVar63._12_4_ = auVar63._0_4_;
      uVar23 = vpmovd2m_avx512vl(auVar63);
      auVar58 = vpcmpeqd_avx(auVar63,auVar63);
      auVar25._4_4_ = (uint)((byte)(uVar23 >> 1) & 1) * auVar58._4_4_;
      auVar25._0_4_ = (uint)((byte)uVar23 & 1) * auVar58._0_4_;
      auVar25._8_4_ = (uint)((byte)(uVar23 >> 2) & 1) * auVar58._8_4_;
      auVar25._12_4_ = (uint)((byte)(uVar23 >> 3) & 1) * auVar58._12_4_;
      auVar58 = vblendvps_avx(auVar26,auVar27,auVar25);
      auVar24 = vdpps_avx(auVar58,auVar58,0x7f);
      auVar64._4_12_ = auVar11;
      auVar64._0_4_ = auVar24._0_4_;
      auVar26 = vrsqrt14ss_avx512f(auVar51,auVar64);
      fVar49 = auVar26._0_4_;
      fVar49 = fVar49 * 1.5 - auVar24._0_4_ * 0.5 * fVar49 * fVar49 * fVar49;
      auVar61._0_4_ = auVar58._0_4_ * fVar49;
      auVar61._4_4_ = auVar58._4_4_ * fVar49;
      auVar61._8_4_ = auVar58._8_4_ * fVar49;
      auVar61._12_4_ = auVar58._12_4_ * fVar49;
      auVar58 = vshufps_avx(auVar61,auVar61,0xc9);
      auVar24 = vshufps_avx(auVar59,auVar59,0xc9);
      auVar65._0_4_ = auVar61._0_4_ * auVar24._0_4_;
      auVar65._4_4_ = auVar61._4_4_ * auVar24._4_4_;
      auVar65._8_4_ = auVar61._8_4_ * auVar24._8_4_;
      auVar65._12_4_ = auVar61._12_4_ * auVar24._12_4_;
      auVar58 = vfmsub231ps_fma(auVar65,auVar59,auVar58);
      auVar24 = vshufps_avx(auVar58,auVar58,0xc9);
      auVar58 = vdpps_avx(auVar24,auVar24,0x7f);
      auVar55._4_12_ = auVar11;
      auVar55._0_4_ = auVar58._0_4_;
      auVar26 = vrsqrt14ss_avx512f(auVar51,auVar55);
      fVar49 = auVar26._0_4_;
      fVar49 = fVar49 * 1.5 - auVar58._0_4_ * 0.5 * fVar49 * fVar49 * fVar49;
      auVar56._0_4_ = auVar24._0_4_ * fVar49;
      auVar56._4_4_ = auVar24._4_4_ * fVar49;
      auVar56._8_4_ = auVar24._8_4_ * fVar49;
      auVar56._12_4_ = auVar24._12_4_ * fVar49;
      auVar58._0_4_ = auVar59._0_4_ * pre.depth_scale;
      auVar58._4_4_ = auVar59._4_4_ * pre.depth_scale;
      auVar58._8_4_ = auVar59._8_4_ * pre.depth_scale;
      auVar58._12_4_ = auVar59._12_4_ * pre.depth_scale;
      auVar26 = vunpcklps_avx(auVar61,auVar58);
      auVar58 = vunpckhps_avx(auVar61,auVar58);
      auVar27 = vunpcklps_avx(auVar56,auVar51);
      auVar24 = vunpckhps_avx(auVar56,auVar51);
      pre.ray_space.vx.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar26,auVar27);
      pre.ray_space.vy.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpckhps_avx(auVar26,auVar27);
      pre.ray_space.vz.field_0 =
           (anon_union_16_2_47237d3f_for_Vec3fa_0)vunpcklps_avx(auVar58,auVar24);
      pNVar19 = stack + 1;
      stack[0].ptr = *(size_t *)&This->ptr[1].bounds.bounds0.lower.field_0;
      auVar58 = vmaxss_avx(ZEXT816(0) << 0x40,ZEXT416((uint)(ray->org).field_0.m128[3]));
      auVar24._8_4_ = 0x7fffffff;
      auVar24._0_8_ = 0x7fffffff7fffffff;
      auVar24._12_4_ = 0x7fffffff;
      auVar24 = vandps_avx512vl((undefined1  [16])aVar7,auVar24);
      auVar51._8_4_ = 0x219392ef;
      auVar51._0_8_ = 0x219392ef219392ef;
      auVar51._12_4_ = 0x219392ef;
      uVar23 = vcmpps_avx512vl(auVar24,auVar51,1);
      bVar8 = (bool)((byte)uVar23 & 1);
      auVar27._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * (int)aVar7.x;
      bVar8 = (bool)((byte)(uVar23 >> 1) & 1);
      auVar27._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * (int)aVar7.y;
      bVar8 = (bool)((byte)(uVar23 >> 2) & 1);
      auVar27._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * (int)aVar7.z;
      bVar8 = (bool)((byte)(uVar23 >> 3) & 1);
      auVar27._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * aVar7.field_3.a;
      auVar24 = vrcp14ps_avx512vl(auVar27);
      auVar26._8_4_ = 0x3f800000;
      auVar26._0_8_ = &DAT_3f8000003f800000;
      auVar26._12_4_ = 0x3f800000;
      auVar26 = vfnmadd213ps_avx512vl(auVar27,auVar24,auVar26);
      auVar27 = vfmadd132ps_fma(auVar26,auVar24,auVar24);
      uVar4 = *(undefined4 *)&(ray->org).field_0;
      uVar5 = *(undefined4 *)((long)&(ray->org).field_0 + 4);
      uVar6 = *(undefined4 *)((long)&(ray->org).field_0 + 8);
      auVar28 = vbroadcastss_avx512vl(auVar27);
      auVar24 = vmovshdup_avx(auVar27);
      auVar29 = vbroadcastsd_avx512vl(auVar24);
      auVar26 = vshufpd_avx(auVar27,auVar27,1);
      auVar31._8_4_ = 2;
      auVar31._0_8_ = 0x200000002;
      auVar31._12_4_ = 2;
      auVar31._16_4_ = 2;
      auVar31._20_4_ = 2;
      auVar31._24_4_ = 2;
      auVar31._28_4_ = 2;
      auVar30 = vpermps_avx512vl(auVar31,ZEXT1632(auVar27));
      fVar49 = auVar27._0_4_ * (ray->org).field_0.m128[0];
      auVar33._4_4_ = fVar49;
      auVar33._0_4_ = fVar49;
      auVar33._8_4_ = fVar49;
      auVar33._12_4_ = fVar49;
      auVar33._16_4_ = fVar49;
      auVar33._20_4_ = fVar49;
      auVar33._24_4_ = fVar49;
      auVar33._28_4_ = fVar49;
      auVar34._8_4_ = 1;
      auVar34._0_8_ = 0x100000001;
      auVar34._12_4_ = 1;
      auVar34._16_4_ = 1;
      auVar34._20_4_ = 1;
      auVar34._24_4_ = 1;
      auVar34._28_4_ = 1;
      auVar35 = ZEXT1632(CONCAT412(auVar27._12_4_ * (ray->org).field_0.m128[3],
                                   CONCAT48(auVar27._8_4_ * (ray->org).field_0.m128[2],
                                            CONCAT44(auVar27._4_4_ * (ray->org).field_0.m128[1],
                                                     fVar49))));
      auVar34 = vpermps_avx2(auVar34,auVar35);
      auVar35 = vpermps_avx2(auVar31,auVar35);
      uVar23 = (ulong)(auVar27._0_4_ < 0.0) * 0x20;
      uVar21 = (ulong)(auVar24._0_4_ < 0.0) << 5 | 0x40;
      uVar20 = (ulong)(auVar26._0_4_ < 0.0) << 5 | 0x80;
      auVar31 = vbroadcastss_avx512vl(auVar58);
      auVar32 = vbroadcastss_avx512vl(ZEXT416((uint)fVar1));
      auVar33 = vxorps_avx512vl(auVar33,auVar36);
      auVar34 = vxorps_avx512vl(auVar34,auVar36);
      auVar35 = vxorps_avx512vl(auVar35,auVar36);
      do {
        if (pNVar19 == stack) {
          return;
        }
        uVar16 = pNVar19[-1].ptr;
        pNVar19 = pNVar19 + -1;
        do {
          if ((uVar16 & 0xf) == 0) {
            auVar36 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar16 + 0x40 + uVar23),auVar33,auVar28);
            auVar37 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar16 + 0x40 + uVar21),auVar34,auVar29);
            auVar36 = vpmaxsd_avx2(auVar36,auVar37);
            auVar38 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar16 + 0x40 + uVar20),auVar35,auVar30);
            auVar37 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar16 + 0x40 + (uVar23 ^ 0x20)),auVar33,
                                 auVar28);
            auVar39 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar16 + 0x40 + (uVar21 ^ 0x20)),auVar34,
                                 auVar29);
            auVar37 = vpminsd_avx2(auVar37,auVar39);
            auVar39 = vfmadd132ps_avx512vl
                                (*(undefined1 (*) [32])(uVar16 + 0x40 + (uVar20 ^ 0x20)),auVar35,
                                 auVar30);
            auVar38 = vpmaxsd_avx512vl(auVar38,auVar31);
            auVar38 = vpmaxsd_avx2(auVar36,auVar38);
            auVar36 = vpminsd_avx512vl(auVar39,auVar32);
            auVar37 = vpminsd_avx2(auVar37,auVar36);
            uVar10 = vpcmpd_avx512vl(auVar38,auVar37,2);
            bVar22 = (byte)uVar10;
LAB_0071f5cb:
            auVar45 = ZEXT3264(auVar37);
            auVar43 = ZEXT3264(auVar38);
            unaff_R15 = CONCAT44((int)(unaff_R15 >> 0x20),(uint)bVar22);
            bVar8 = true;
          }
          else {
            if ((int)(uVar16 & 0xf) == 2) {
              uVar14 = uVar16 & 0xfffffffffffffff0;
              auVar36 = *(undefined1 (*) [32])(uVar14 + 0x100);
              auVar44._0_4_ = fVar53 * auVar36._0_4_;
              auVar44._4_4_ = fVar53 * auVar36._4_4_;
              auVar44._8_4_ = fVar53 * auVar36._8_4_;
              auVar44._12_4_ = fVar53 * auVar36._12_4_;
              auVar44._16_4_ = fVar53 * auVar36._16_4_;
              auVar44._20_4_ = fVar53 * auVar36._20_4_;
              auVar44._28_36_ = auVar43._28_36_;
              auVar44._24_4_ = fVar53 * auVar36._24_4_;
              auVar37 = *(undefined1 (*) [32])(uVar14 + 0x120);
              auVar46._0_4_ = fVar53 * auVar37._0_4_;
              auVar46._4_4_ = fVar53 * auVar37._4_4_;
              auVar46._8_4_ = fVar53 * auVar37._8_4_;
              auVar46._12_4_ = fVar53 * auVar37._12_4_;
              auVar46._16_4_ = fVar53 * auVar37._16_4_;
              auVar46._20_4_ = fVar53 * auVar37._20_4_;
              auVar46._28_36_ = auVar45._28_36_;
              auVar46._24_4_ = fVar53 * auVar37._24_4_;
              auVar38 = *(undefined1 (*) [32])(uVar14 + 0x140);
              auVar39._4_4_ = fVar53 * auVar38._4_4_;
              auVar39._0_4_ = fVar53 * auVar38._0_4_;
              auVar39._8_4_ = fVar53 * auVar38._8_4_;
              auVar39._12_4_ = fVar53 * auVar38._12_4_;
              auVar39._16_4_ = fVar53 * auVar38._16_4_;
              auVar39._20_4_ = fVar53 * auVar38._20_4_;
              auVar39._24_4_ = fVar53 * auVar38._24_4_;
              auVar39._28_4_ = fVar53;
              auVar48._4_4_ = uVar3;
              auVar48._0_4_ = uVar3;
              auVar48._8_4_ = uVar3;
              auVar48._12_4_ = uVar3;
              auVar48._16_4_ = uVar3;
              auVar48._20_4_ = uVar3;
              auVar48._24_4_ = uVar3;
              auVar48._28_4_ = uVar3;
              auVar58 = vfmadd231ps_fma(auVar44._0_32_,auVar48,*(undefined1 (*) [32])(uVar14 + 0xa0)
                                       );
              auVar24 = vfmadd231ps_fma(auVar46._0_32_,auVar48,*(undefined1 (*) [32])(uVar14 + 0xc0)
                                       );
              auVar26 = vfmadd231ps_fma(auVar39,auVar48,*(undefined1 (*) [32])(uVar14 + 0xe0));
              auVar12._4_4_ = uVar2;
              auVar12._0_4_ = uVar2;
              auVar12._8_4_ = uVar2;
              auVar12._12_4_ = uVar2;
              auVar12._16_4_ = uVar2;
              auVar12._20_4_ = uVar2;
              auVar12._24_4_ = uVar2;
              auVar12._28_4_ = uVar2;
              auVar58 = vfmadd231ps_fma(ZEXT1632(auVar58),auVar12,
                                        *(undefined1 (*) [32])(uVar14 + 0x40));
              auVar24 = vfmadd231ps_fma(ZEXT1632(auVar24),auVar12,
                                        *(undefined1 (*) [32])(uVar14 + 0x60));
              auVar26 = vfmadd231ps_fma(ZEXT1632(auVar26),auVar12,
                                        *(undefined1 (*) [32])(uVar14 + 0x80));
              auVar66._8_4_ = 0x7fffffff;
              auVar66._0_8_ = 0x7fffffff7fffffff;
              auVar66._12_4_ = 0x7fffffff;
              auVar66._16_4_ = 0x7fffffff;
              auVar66._20_4_ = 0x7fffffff;
              auVar66._24_4_ = 0x7fffffff;
              auVar66._28_4_ = 0x7fffffff;
              auVar39 = vandps_avx(auVar66,ZEXT1632(auVar58));
              auVar68._8_4_ = 0x219392ef;
              auVar68._0_8_ = 0x219392ef219392ef;
              auVar68._12_4_ = 0x219392ef;
              auVar68._16_4_ = 0x219392ef;
              auVar68._20_4_ = 0x219392ef;
              auVar68._24_4_ = 0x219392ef;
              auVar68._28_4_ = 0x219392ef;
              uVar15 = vcmpps_avx512vl(auVar39,auVar68,1);
              bVar8 = (bool)((byte)uVar15 & 1);
              auVar40._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar58._0_4_;
              bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
              auVar40._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar58._4_4_;
              bVar8 = (bool)((byte)(uVar15 >> 2) & 1);
              auVar40._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar58._8_4_;
              bVar8 = (bool)((byte)(uVar15 >> 3) & 1);
              auVar40._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar58._12_4_;
              auVar40._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * 0x219392ef;
              auVar40._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * 0x219392ef;
              auVar40._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * 0x219392ef;
              auVar40._28_4_ = (uint)(byte)(uVar15 >> 7) * 0x219392ef;
              auVar39 = vandps_avx(auVar66,ZEXT1632(auVar24));
              uVar15 = vcmpps_avx512vl(auVar39,auVar68,1);
              bVar8 = (bool)((byte)uVar15 & 1);
              auVar41._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar24._0_4_;
              bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
              auVar41._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar24._4_4_;
              bVar8 = (bool)((byte)(uVar15 >> 2) & 1);
              auVar41._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar24._8_4_;
              bVar8 = (bool)((byte)(uVar15 >> 3) & 1);
              auVar41._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar24._12_4_;
              auVar41._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * 0x219392ef;
              auVar41._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * 0x219392ef;
              auVar41._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * 0x219392ef;
              auVar41._28_4_ = (uint)(byte)(uVar15 >> 7) * 0x219392ef;
              auVar39 = vandps_avx(auVar66,ZEXT1632(auVar26));
              uVar15 = vcmpps_avx512vl(auVar39,auVar68,1);
              bVar8 = (bool)((byte)uVar15 & 1);
              auVar42._0_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar26._0_4_;
              bVar8 = (bool)((byte)(uVar15 >> 1) & 1);
              auVar42._4_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar26._4_4_;
              bVar8 = (bool)((byte)(uVar15 >> 2) & 1);
              auVar42._8_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar26._8_4_;
              bVar8 = (bool)((byte)(uVar15 >> 3) & 1);
              auVar42._12_4_ = (uint)bVar8 * 0x219392ef | (uint)!bVar8 * auVar26._12_4_;
              auVar42._16_4_ = (uint)((byte)(uVar15 >> 4) & 1) * 0x219392ef;
              auVar42._20_4_ = (uint)((byte)(uVar15 >> 5) & 1) * 0x219392ef;
              auVar42._24_4_ = (uint)((byte)(uVar15 >> 6) & 1) * 0x219392ef;
              auVar42._28_4_ = (uint)(byte)(uVar15 >> 7) * 0x219392ef;
              auVar39 = vrcp14ps_avx512vl(auVar40);
              auVar67._8_4_ = 0x3f800000;
              auVar67._0_8_ = &DAT_3f8000003f800000;
              auVar67._12_4_ = 0x3f800000;
              auVar67._16_4_ = 0x3f800000;
              auVar67._20_4_ = 0x3f800000;
              auVar67._24_4_ = 0x3f800000;
              auVar67._28_4_ = 0x3f800000;
              auVar58 = vfnmadd213ps_fma(auVar40,auVar39,auVar67);
              auVar58 = vfmadd132ps_fma(ZEXT1632(auVar58),auVar39,auVar39);
              auVar39 = vrcp14ps_avx512vl(auVar41);
              auVar24 = vfnmadd213ps_fma(auVar41,auVar39,auVar67);
              auVar24 = vfmadd132ps_fma(ZEXT1632(auVar24),auVar39,auVar39);
              auVar39 = vrcp14ps_avx512vl(auVar42);
              auVar26 = vfnmadd213ps_fma(auVar42,auVar39,auVar67);
              auVar26 = vfmadd132ps_fma(ZEXT1632(auVar26),auVar39,auVar39);
              auVar9._4_4_ = uVar6;
              auVar9._0_4_ = uVar6;
              auVar9._8_4_ = uVar6;
              auVar9._12_4_ = uVar6;
              auVar9._16_4_ = uVar6;
              auVar9._20_4_ = uVar6;
              auVar9._24_4_ = uVar6;
              auVar9._28_4_ = uVar6;
              auVar27 = vfmadd213ps_fma(auVar36,auVar9,*(undefined1 (*) [32])(uVar14 + 0x160));
              auVar25 = vfmadd213ps_fma(auVar37,auVar9,*(undefined1 (*) [32])(uVar14 + 0x180));
              auVar47 = vfmadd213ps_fma(auVar38,auVar9,*(undefined1 (*) [32])(uVar14 + 0x1a0));
              auVar37._4_4_ = uVar5;
              auVar37._0_4_ = uVar5;
              auVar37._8_4_ = uVar5;
              auVar37._12_4_ = uVar5;
              auVar37._16_4_ = uVar5;
              auVar37._20_4_ = uVar5;
              auVar37._24_4_ = uVar5;
              auVar37._28_4_ = uVar5;
              auVar27 = vfmadd231ps_fma(ZEXT1632(auVar27),auVar37,
                                        *(undefined1 (*) [32])(uVar14 + 0xa0));
              auVar25 = vfmadd231ps_fma(ZEXT1632(auVar25),auVar37,
                                        *(undefined1 (*) [32])(uVar14 + 0xc0));
              auVar47 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar37,
                                        *(undefined1 (*) [32])(uVar14 + 0xe0));
              auVar38._4_4_ = uVar4;
              auVar38._0_4_ = uVar4;
              auVar38._8_4_ = uVar4;
              auVar38._12_4_ = uVar4;
              auVar38._16_4_ = uVar4;
              auVar38._20_4_ = uVar4;
              auVar38._24_4_ = uVar4;
              auVar38._28_4_ = uVar4;
              auVar27 = vfmadd231ps_fma(ZEXT1632(auVar27),auVar38,
                                        *(undefined1 (*) [32])(uVar14 + 0x40));
              auVar57._0_4_ = -auVar58._0_4_ * auVar27._0_4_;
              auVar57._4_4_ = -auVar58._4_4_ * auVar27._4_4_;
              auVar57._8_4_ = -auVar58._8_4_ * auVar27._8_4_;
              auVar57._12_4_ = -auVar58._12_4_ * auVar27._12_4_;
              auVar57._16_4_ = 0x80000000;
              auVar57._20_4_ = 0x80000000;
              auVar57._24_4_ = 0x80000000;
              auVar57._28_4_ = 0;
              auVar27 = vfmadd231ps_fma(ZEXT1632(auVar25),auVar38,
                                        *(undefined1 (*) [32])(uVar14 + 0x60));
              auVar52._0_4_ = -auVar24._0_4_ * auVar27._0_4_;
              auVar52._4_4_ = -auVar24._4_4_ * auVar27._4_4_;
              auVar52._8_4_ = -auVar24._8_4_ * auVar27._8_4_;
              auVar52._12_4_ = -auVar24._12_4_ * auVar27._12_4_;
              auVar52._16_4_ = 0x80000000;
              auVar52._20_4_ = 0x80000000;
              auVar52._24_4_ = 0x80000000;
              auVar52._28_4_ = 0;
              auVar27 = vfmadd231ps_fma(ZEXT1632(auVar47),auVar38,
                                        *(undefined1 (*) [32])(uVar14 + 0x80));
              auVar50._0_4_ = -auVar26._0_4_ * auVar27._0_4_;
              auVar50._4_4_ = -auVar26._4_4_ * auVar27._4_4_;
              auVar50._8_4_ = -auVar26._8_4_ * auVar27._8_4_;
              auVar50._12_4_ = -auVar26._12_4_ * auVar27._12_4_;
              auVar50._16_4_ = 0x80000000;
              auVar50._20_4_ = 0x80000000;
              auVar50._24_4_ = 0x80000000;
              auVar50._28_4_ = 0;
              auVar38 = ZEXT1632(CONCAT412(auVar58._12_4_ + auVar57._12_4_,
                                           CONCAT48(auVar58._8_4_ + auVar57._8_4_,
                                                    CONCAT44(auVar58._4_4_ + auVar57._4_4_,
                                                             auVar58._0_4_ + auVar57._0_4_))));
              auVar39 = ZEXT1632(CONCAT412(auVar24._12_4_ + auVar52._12_4_,
                                           CONCAT48(auVar24._8_4_ + auVar52._8_4_,
                                                    CONCAT44(auVar24._4_4_ + auVar52._4_4_,
                                                             auVar24._0_4_ + auVar52._0_4_))));
              auVar48 = ZEXT1632(CONCAT412(auVar26._12_4_ + auVar50._12_4_,
                                           CONCAT48(auVar26._8_4_ + auVar50._8_4_,
                                                    CONCAT44(auVar26._4_4_ + auVar50._4_4_,
                                                             auVar26._0_4_ + auVar50._0_4_))));
              auVar9 = vpminsd_avx2(auVar57,auVar38);
              auVar36 = vpminsd_avx2(auVar52,auVar39);
              auVar37 = vpminsd_avx2(auVar50,auVar48);
              auVar36 = vmaxps_avx(auVar36,auVar37);
              auVar38 = vpmaxsd_avx2(auVar57,auVar38);
              auVar37 = vpmaxsd_avx2(auVar52,auVar39);
              auVar39 = vpmaxsd_avx2(auVar50,auVar48);
              auVar37 = vminps_avx(auVar37,auVar39);
              auVar39 = vmaxps_avx512vl(auVar31,auVar9);
              auVar36 = vmaxps_avx(auVar39,auVar36);
              auVar38 = vminps_avx512vl(auVar32,auVar38);
              auVar38 = vminps_avx(auVar38,auVar37);
              uVar10 = vcmpps_avx512vl(auVar36,auVar38,2);
              bVar22 = (byte)uVar10;
              goto LAB_0071f5cb;
            }
            bVar8 = false;
          }
          if (bVar8) {
            if (unaff_R15 == 0) {
              iVar17 = 4;
            }
            else {
              uVar15 = uVar16 & 0xfffffffffffffff0;
              lVar18 = 0;
              for (uVar16 = unaff_R15; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000)
              {
                lVar18 = lVar18 + 1;
              }
              iVar17 = 0;
              for (uVar14 = unaff_R15 - 1 & unaff_R15; uVar16 = *(ulong *)(uVar15 + lVar18 * 8),
                  uVar14 != 0; uVar14 = uVar14 - 1 & uVar14) {
                pNVar19->ptr = uVar16;
                pNVar19 = pNVar19 + 1;
                lVar18 = 0;
                for (uVar16 = uVar14; (uVar16 & 1) == 0; uVar16 = uVar16 >> 1 | 0x8000000000000000)
                {
                  lVar18 = lVar18 + 1;
                }
              }
            }
          }
          else {
            iVar17 = 6;
          }
        } while (iVar17 == 0);
        if (iVar17 == 6) {
          cVar13 = (**(code **)((long)This->leafIntersector +
                               (ulong)*(byte *)(uVar16 & 0xfffffffffffffff0) * 0x40 + 8))
                             (&pre,ray,context);
          auVar45._8_56_ = extraout_var_00;
          auVar45._0_8_ = extraout_XMM1_Qa;
          auVar43._8_56_ = extraout_var;
          auVar43._0_8_ = extraout_XMM0_Qa;
          iVar17 = 0;
          if (cVar13 != '\0') {
            ray->tfar = -INFINITY;
            iVar17 = 3;
          }
        }
      } while (iVar17 != 3);
    }
  }
  return;
}

Assistant:

void BVHNIntersector1<N, types, robust, PrimitiveIntersector1>::occluded(const Accel::Intersectors* __restrict__ This,
                                                                             Ray& __restrict__ ray,
                                                                             RayQueryContext* __restrict__ context)
    {
      const BVH* __restrict__ bvh = (const BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
       
      /* early out for already occluded rays */
      if (unlikely(ray.tfar < 0.0f))
        return;

      /* perform per ray precalculations required by the primitive intersector */
      Precalculations pre(ray, bvh);

      /* stack state */
      NodeRef stack[stackSize];    // stack of nodes that still need to get traversed
      NodeRef* stackPtr = stack+1; // current stack pointer
      NodeRef* stackEnd = stack+stackSize;
      stack[0] = bvh->root;

      /* filter out invalid rays */
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      if (!ray.valid()) return;
#endif

      /* verify correct input */
      assert(ray.valid());
      assert(ray.tnear() >= 0.0f);
      assert(!(types & BVH_MB) || (ray.time() >= 0.0f && ray.time() <= 1.0f));

      /* load the ray into SIMD registers */
      TravRay<N,robust> tray(ray.org, ray.dir, max(ray.tnear(), 0.0f), max(ray.tfar, 0.0f));

      /* initialize the node traverser */
      BVHNNodeTraverser1Hit<N, types> nodeTraverser;

      /* pop loop */
      while (true) pop:
      {
        /* pop next node */
        if (unlikely(stackPtr == stack)) break;
        stackPtr--;
        NodeRef cur = (NodeRef)*stackPtr;

        /* downtraversal loop */
        while (true)
        {
          /* intersect node */
          size_t mask; vfloat<N> tNear;
          STAT3(shadow.trav_nodes,1,1,1);
          bool nodeIntersected = BVHNNodeIntersector1<N, types, robust>::intersect(cur, tray, ray.time(), tNear, mask);
          if (unlikely(!nodeIntersected)) { STAT3(shadow.trav_nodes,-1,-1,-1); break; }

          /* if no child is hit, pop next node */
          if (unlikely(mask == 0))
            goto pop;

          /* select next child and push other children */
          nodeTraverser.traverseAnyHit(cur, mask, tNear, stackPtr, stackEnd);
        }

        /* this is a leaf node */
        assert(cur != BVH::emptyNode);
        STAT3(shadow.trav_leaves,1,1,1);
        size_t num; Primitive* prim = (Primitive*)cur.leaf(num);
        size_t lazy_node = 0;
        if (PrimitiveIntersector1::occluded(This, pre, ray, context, prim, num, tray, lazy_node)) {
          ray.tfar = neg_inf;
          break;
        }

        /* push lazy node onto stack */
        if (unlikely(lazy_node)) {
          *stackPtr = (NodeRef)lazy_node;
          stackPtr++;
        }
      }
    }